

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeDefs.cpp
# Opt level: O0

string * __thiscall
xe::formatError_abi_cxx11_
          (string *__return_storage_ptr__,xe *this,char *message,char *expr,char *file,int line)

{
  ostream *poVar1;
  xe *local_1d0;
  ostringstream local_1a8 [8];
  ostringstream msg;
  int line_local;
  char *file_local;
  char *expr_local;
  char *message_local;
  
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  local_1d0 = this;
  if (this == (xe *)0x0) {
    local_1d0 = (xe *)0x1642ec;
  }
  poVar1 = std::operator<<((ostream *)local_1a8,(char *)local_1d0);
  std::operator<<(poVar1,": ");
  if (message != (char *)0x0) {
    poVar1 = std::operator<<((ostream *)local_1a8,'\'');
    poVar1 = std::operator<<(poVar1,message);
    std::operator<<(poVar1,'\'');
  }
  poVar1 = std::operator<<((ostream *)local_1a8," at ");
  poVar1 = std::operator<<(poVar1,expr);
  poVar1 = std::operator<<(poVar1,":");
  std::ostream::operator<<(poVar1,(int)file);
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  return __return_storage_ptr__;
}

Assistant:

static std::string formatError (const char* message, const char* expr, const char* file, int line)
{
	std::ostringstream msg;
	msg << (message ? message : "Runtime check failed") << ": ";
	if (expr)
		msg << '\'' << expr << '\'';
	msg << " at " << file << ":" << line;
	return msg.str();
}